

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O0

bool intersects(Bounds *x,Bounds *y,int dim,bool wrap,Bounds *domain)

{
  const_reference pfVar1;
  byte in_CL;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  float fVar2;
  undefined4 in_stack_ffffffffffffffc0;
  float fVar3;
  uint in_stack_ffffffffffffffc4;
  uint uVar4;
  
  if ((in_CL & 1) != 0) {
    pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    fVar3 = *pfVar1;
    pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
      pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      fVar3 = *pfVar1;
      pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
        return true;
      }
    }
    pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    fVar3 = *pfVar1;
    pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
      pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      fVar3 = *pfVar1;
      pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
        return true;
      }
    }
  }
  pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  fVar3 = *pfVar1;
  pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                      CONCAT44(in_stack_ffffffffffffffc4,fVar3),
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar4 = in_stack_ffffffffffffffc4 & 0xffffff;
  if (fVar3 <= *pfVar1) {
    pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        (CONCAT44(in_stack_ffffffffffffffc4,fVar3) & 0xffffffffffffff),
                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    fVar2 = *pfVar1;
    pfVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                       ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)
                        CONCAT44(uVar4,fVar3),CONCAT44(fVar2,in_stack_ffffffffffffffb8));
    uVar4 = (uint)(fVar2 <= *pfVar1) << 0x18;
  }
  return SUB41(uVar4 >> 0x18,0);
}

Assistant:

bool intersects(const Bounds& x, const Bounds& y, int dim, bool wrap, const Bounds& domain)
{
    if (wrap)
    {
        if (x.min[dim] == domain.min[dim] && y.max[dim] == domain.max[dim])
            return true;
        if (y.min[dim] == domain.min[dim] && x.max[dim] == domain.max[dim])
            return true;
    }
    return x.min[dim] <= y.max[dim] && y.min[dim] <= x.max[dim];
}